

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O3

CTcPrsNode * __thiscall CTPNListBase::fold_constants(CTPNListBase *this,CTcPrsSymtab *symtab)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  CTPNListEle *pCVar3;
  
  if ((this->field_0x48 & 1) == 0) {
    pCVar3 = this->head_;
    if (pCVar3 != (CTPNListEle *)0x0) {
      bVar1 = true;
      do {
        (*(pCVar3->super_CTPNListEleBase).super_CTcPrsNode.super_CTcPrsNodeBase._vptr_CTcPrsNodeBase
          [0xf])(pCVar3,symtab);
        iVar2 = (*(((pCVar3->super_CTPNListEleBase).expr_)->super_CTcPrsNodeBase).
                  _vptr_CTcPrsNodeBase[1])();
        if (CONCAT44(extraout_var,iVar2) == 0) {
          bVar1 = false;
        }
        pCVar3 = (pCVar3->super_CTPNListEleBase).next_;
      } while (pCVar3 != (CTPNListEle *)0x0);
      if (!bVar1) {
        return &this->super_CTcPrsNode;
      }
    }
    this->field_0x48 = this->field_0x48 | 1;
  }
  return &this->super_CTcPrsNode;
}

Assistant:

CTcPrsNode *CTPNListBase::fold_constants(CTcPrsSymtab *symtab)
{
    CTPNListEle *cur;
    int all_const;

    /* 
     *   if the list is already constant, there's nothing extra we need to
     *   do 
     */
    if (is_const_)
        return this;

    /* presume the result will be all constants */
    all_const = TRUE;
    
    /* run through my list and fold each element */
    for (cur = head_ ; cur != 0 ; cur = cur->get_next())
    {
        /* fold this element */
        cur->fold_constants(symtab);

        /* 
         *   if this element is not a constant, the whole list cannot be
         *   constant 
         */
        if (!cur->get_expr()->is_const())
            all_const = FALSE;
    }

    /* if every element was a constant, the overall list is constant */
    if (all_const)
        is_const_ = TRUE;

    /* return myself */
    return this;
}